

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_filter.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::filter_impl
          (filter_impl<std::array<unsigned_char,_4UL>_> *this)

{
  array<unsigned_char,_4UL> addr;
  range local_18;
  filter_impl<std::array<unsigned_char,_4UL>_> *local_10;
  filter_impl<std::array<unsigned_char,_4UL>_> *this_local;
  
  local_10 = this;
  ::std::
  set<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
  ::set(&this->m_access_list);
  addr = zero<std::array<unsigned_char,4ul>>();
  range::range(&local_18,addr,0);
  ::std::
  set<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
  ::insert(&this->m_access_list,&local_18);
  return;
}

Assistant:

filter_impl<Addr>::filter_impl()
	{
		// make the entire ip-range non-blocked
		m_access_list.insert(range(zero<Addr>(), 0));
	}